

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqliteBuiltin_db_reset_record_cursor(jx9_context *pCtx,int argc,jx9_value **argv)

{
  jx9_user_func *pjVar1;
  jx9_value *pObj;
  char *pcVar2;
  unqlite_col *puVar3;
  int iFlag;
  jx9_vm *pVm;
  jx9_real jVar4;
  int nByte;
  SyString sName;
  uint local_24;
  SyString local_20;
  
  if (argc < 1) {
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar2 = "Missing collection name";
LAB_0011894c:
    jx9VmThrowError(pVm,&pjVar1->sName,1,pcVar2);
  }
  else {
    pcVar2 = jx9_value_to_string(*argv,(int *)&local_24);
    if ((int)local_24 < 1) {
      pjVar1 = pCtx->pFunc;
      pVm = pCtx->pVm;
      pcVar2 = "Invalid collection name";
      goto LAB_0011894c;
    }
    local_20.nByte = local_24;
    local_20.zString = pcVar2;
    puVar3 = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&local_20,iFlag);
    if (puVar3 != (unqlite_col *)0x0) {
      puVar3->nCurid = 0;
      jVar4 = 4.94065645841247e-324;
      goto LAB_00118959;
    }
  }
  jVar4 = 0.0;
LAB_00118959:
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = jVar4;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int unqliteBuiltin_db_reset_record_cursor(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		unqliteCollectionResetRecordCursor(pCol);
		jx9_result_bool(pCtx,1);
	}else{
		/* No such collection */
		jx9_result_bool(pCtx,0);
	}
	return JX9_OK;
}